

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

ON_3dVector * __thiscall
ON_SubDMeshFragment::VertexNormal
          (ON_3dVector *__return_storage_ptr__,ON_SubDMeshFragment *this,uint grid_point_index)

{
  double dVar1;
  
  if (((this->m_N == (double *)0x0) || (this->m_N_stride < 3)) ||
     ((this->m_vertex_count_etc & 0x1fff) <= grid_point_index)) {
    __return_storage_ptr__->z = ON_3dVector::ZeroVector.z;
    dVar1 = ON_3dVector::ZeroVector.y;
    __return_storage_ptr__->x = ON_3dVector::ZeroVector.x;
    __return_storage_ptr__->y = dVar1;
  }
  else {
    ON_3dVector::ON_3dVector
              (__return_storage_ptr__,this->m_N + this->m_N_stride * (ulong)grid_point_index);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_3dVector ON_SubDMeshFragment::VertexNormal(
  unsigned grid_point_index
) const
{
  return
    (grid_point_index >= NormalCount())
    ? ON_3dVector::ZeroVector
    : ON_3dVector(m_N + grid_point_index * m_N_stride)
    ;
}